

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_add_mem_ex_v2
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32,time_t *last_modified,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pArray;
  mz_uint16 filename_size;
  mz_uint64 *pmVar1;
  char *user_extra_data_00;
  tdefl_compressor *d;
  mz_uint64 mVar2;
  undefined1 uVar3;
  mz_bool mVar4;
  tdefl_status tVar5;
  mz_uint32 mVar6;
  time_t *ptVar7;
  mz_ulong mVar8;
  size_t sVar9;
  mz_uint64 *pmVar10;
  undefined4 extraout_var;
  size_t sVar11;
  size_t sVar12;
  undefined4 extraout_var_00;
  sbyte sVar13;
  ushort uVar14;
  mz_uint64 *pmVar15;
  mz_uint64 *pmVar16;
  sbyte sVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  sbyte sVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  mz_uint64 mVar27;
  uint uVar28;
  bool bVar29;
  bool local_131;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  size_t local_120;
  char *local_118;
  mz_uint64 comp_size;
  mz_uint8 *local_108;
  tdefl_compressor *local_100;
  mz_zip_writer_add_state state;
  mz_uint64 local_dir_header_ofs;
  uint local_c4;
  uint local_c0;
  int local_bc;
  ulong local_b8;
  undefined8 local_b0;
  ulong local_a8;
  mz_uint8 *local_a0;
  time_t cur_time;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  long lStack_82;
  mz_ulong local_70;
  ulong local_68;
  void *local_60;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  mVar27 = pZip->m_archive_size;
  comp_size = 0;
  uVar28 = 6;
  if (-1 < (int)level_and_flags) {
    uVar28 = level_and_flags;
  }
  if (uncomp_size == 0) {
    uVar14 = (ushort)((uVar28 & 0x400) == 0 && buf_size != 0) << 3;
  }
  else {
    uVar14 = 8;
  }
  uVar25 = uVar28 & 0x400;
  local_a8 = (ulong)uVar14;
  if ((uVar28 >> 0x10 & 1) == 0) {
    local_a8 = (ulong)(uVar14 + 0x800);
  }
  uVar28 = uVar28 & 0xf;
  bVar29 = uVar28 == 0;
  pArray = pZip->m_pState;
  if ((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
LAB_005bfb28:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if ((pArchive_name == (char *)0x0) ||
     ((pBuf == (void *)0x0 && buf_size != 0 ||
      (pComment == (void *)0x0 && comment_size != 0 || 10 < uVar28)))) goto LAB_005bfb28;
  if (pArray->m_zip64 == 0) {
    if ((uncomp_size | buf_size) >> 0x20 != 0 || pZip->m_total_files == 0xffff) {
      pArray->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  if (uncomp_size != 0 && uVar25 == 0) goto LAB_005bfb28;
  if (*pArchive_name == '/') {
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  local_60 = pComment;
  ptVar7 = last_modified;
  local_120 = buf_size;
  local_118 = pArchive_name;
  local_dir_header_ofs = mVar27;
  local_a0 = (mz_uint8 *)pBuf;
  if (last_modified == (time_t *)0x0) {
    time(&cur_time);
    ptVar7 = &cur_time;
  }
  mz_zip_time_t_to_dos_time(*ptVar7,&dos_time,&dos_date);
  sVar11 = local_120;
  if (uVar25 == 0) {
    mVar8 = mz_crc32(0,local_a0,local_120);
    uncomp_size = sVar11;
    if (sVar11 < 4) {
      uVar28 = 0;
    }
    local_131 = sVar11 < 4 || (bVar29 || uVar25 != 0);
  }
  else {
    mVar8 = (mz_ulong)uncomp_crc32;
    local_131 = true;
  }
  sVar9 = strlen(local_118);
  if (0xffff < sVar9) {
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    uVar26 = 0;
  }
  else {
    iVar24 = (int)pZip->m_file_offset_alignment;
    uVar18 = iVar24 - 1;
    uVar26 = (ulong)(iVar24 - ((uint)pZip->m_archive_size & uVar18) & uVar18);
  }
  sVar11 = (pArray->m_central_dir).m_size;
  local_68 = (ulong)comment_size;
  if (0xfffffffe < sVar11 + local_68 + sVar9 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  lVar19 = 0x1c;
  if (pArray->m_zip64 == 0) {
    if ((pZip->m_archive_size +
        user_extra_data_len + local_68 + (ulong)user_extra_data_central_len + sVar9 * 2 + uVar26 +
        sVar11) - 0xffffff8e < 0xffffffff00000000) {
      pArray->m_zip64 = 1;
    }
    else {
      lVar19 = 0;
    }
  }
  local_b0 = 0;
  if (((sVar9 != 0) && (local_118[sVar9 - 1] == '/')) &&
     (local_b0 = 0x10, uncomp_size != 0 || local_120 != 0)) goto LAB_005bfb28;
  uVar20 = lVar19 + local_68 + sVar9 + sVar11 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar20) &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,1), mVar4 == 0)) ||
     ((uVar20 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar20 &&
      (mVar4 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar20,1),
      mVar4 == 0)))) {
LAB_005bfe94:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  if (local_120 == 0 || local_131 != false) {
    local_100 = (tdefl_compressor *)0x0;
  }
  else {
    local_100 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_100 == (tdefl_compressor *)0x0) goto LAB_005bfe94;
  }
  local_70 = mVar8;
  mVar4 = mz_zip_writer_write_zeros(pZip,mVar27,(mz_uint32)uVar26);
  if (mVar4 == 0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
    return 0;
  }
  local_dir_header_ofs = local_dir_header_ofs + uVar26;
  if ((pZip->m_file_offset_alignment != 0) &&
     ((pZip->m_file_offset_alignment - 1 & local_dir_header_ofs) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/miniz.c"
                  ,0x18d6,
                  "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  uVar26 = mVar27 + uVar26;
  uStack_88 = 0;
  lStack_82 = 0;
  cur_time = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8d = 0;
  uStack_8c = 0;
  uStack_8b = 0;
  uStack_8a = 0;
  bVar21 = local_131 ^ 1U | uVar25 != 0;
  iVar24 = (uint)bVar21 << 3;
  filename_size = (mz_uint16)sVar9;
  local_bc = iVar24;
  if (pArray->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar26 >> 0x20 != 0)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    uVar3 = 0x14;
    if (bVar21 == 0) {
      uVar3 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar3,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)local_a8,(uint6)cur_time);
    cur_time = CONCAT17((char)(local_a8 >> 8),(undefined7)cur_time);
    uStack_8e = (undefined1)dos_time;
    local_c0 = (uint)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    local_c4 = (uint)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,filename_size)) << 0x20;
    uStack_90 = (char)iVar24;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar11 != 0x1e) goto LAB_005c0353;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar26 + 0x1e,local_118,sVar9);
    if (sVar11 != sVar9) goto LAB_005c0347;
    mVar27 = uVar26 + 0x1e + sVar9;
    local_108 = (mz_uint8 *)0x0;
    local_b8 = 0;
  }
  else {
    if ((uncomp_size < 0xffffffff) && (local_dir_header_ofs < 0xffffffff)) {
      local_108 = (mz_uint8 *)0x0;
      local_b8 = 0;
    }
    else {
      pmVar15 = (mz_uint64 *)0x0;
      pmVar10 = &uncomp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar10 = pmVar15;
      }
      pmVar16 = &comp_size;
      if (uncomp_size < 0xffffffff) {
        pmVar16 = pmVar15;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar15 = &local_dir_header_ofs;
      }
      local_108 = extra_data;
      mVar6 = mz_zip_writer_create_zip64_extra_data(local_108,pmVar10,pmVar16,pmVar15);
      local_b8 = CONCAT44(extraout_var,mVar6);
    }
    iVar23 = (int)local_b8 + user_extra_data_len;
    uVar3 = 0x14;
    if (bVar21 == 0) {
      uVar3 = 0;
    }
    cur_time._0_5_ = CONCAT14(uVar3,0x4034b50);
    cur_time._0_6_ = (uint6)(uint5)cur_time;
    cur_time._0_7_ = CONCAT16((char)(local_a8 & 0xffff),(uint6)cur_time);
    cur_time = CONCAT17((char)((local_a8 & 0xffff) >> 8),(undefined7)cur_time);
    uStack_8f = 0;
    uStack_8e = (undefined1)dos_time;
    local_c0 = (uint)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    local_c4 = (uint)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)((uint)iVar23 >> 8),CONCAT12((char)iVar23,filename_size)) <<
                0x20;
    uStack_90 = (char)iVar24;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,&cur_time,0x1e);
    if (sVar11 != 0x1e) goto LAB_005c0353;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar26 + 0x1e,local_118,sVar9);
    if (sVar11 != sVar9) {
LAB_005c0347:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
LAB_005c0353:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar27 = uVar26 + 0x1e + sVar9;
    if (local_108 == (mz_uint8 *)0x0) {
      local_108 = (mz_uint8 *)0x0;
    }
    else {
      uVar26 = local_b8 & 0xffffffff;
      sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,extra_data,uVar26);
      if (sVar11 != uVar26) goto LAB_005c019e;
      mVar27 = mVar27 + uVar26;
    }
  }
  if (user_extra_data_len != 0) {
    uVar26 = (ulong)user_extra_data_len;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,user_extra_data,uVar26);
    if (sVar11 != uVar26) {
LAB_005c019e:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar27 = mVar27 + uVar26;
  }
  d = local_100;
  sVar11 = local_120;
  if (local_131 == false) {
    mVar2 = comp_size;
    if (local_120 != 0) {
      state.m_comp_size = 0;
      uVar18 = (uint)(uVar28 < 4) << 0xe |
               tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar28];
      uVar25 = uVar18 | 0x80000;
      if (uVar28 != 0) {
        uVar25 = uVar18;
      }
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar27;
      tdefl_init(local_100,mz_zip_writer_add_put_buf_callback,&state,uVar25);
      tVar5 = tdefl_compress_buffer(d,local_a0,local_120,TDEFL_FINISH);
      mVar27 = state.m_cur_archive_file_ofs;
      mVar2 = state.m_comp_size;
      if (tVar5 != TDEFL_STATUS_DONE) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
        pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
        return 0;
      }
    }
  }
  else {
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,local_a0,local_120);
    if (sVar12 != sVar11) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar27 = mVar27 + local_120;
    mVar2 = local_120;
  }
  comp_size = mVar2;
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_100);
  if (uncomp_size == 0) {
    uVar26 = 0;
  }
  else {
    if ((local_a8 & 8) == 0) {
      __assert_fail("bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/miniz.c"
                    ,0x1943,
                    "mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32, time_t *, const char *, mz_uint, const char *, mz_uint)"
                   );
    }
    state.m_pZip = (mz_zip_archive *)
                   CONCAT17((char)(local_70 >> 0x18),
                            CONCAT16((char)(local_70 >> 0x10),
                                     CONCAT15((char)(local_70 >> 8),
                                              CONCAT14((char)local_70,0x8074b50))));
    uVar3 = (undefined1)uncomp_size;
    if (local_108 == (mz_uint8 *)0x0) {
      if (comp_size >> 0x20 != 0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      pmVar10 = &state.m_cur_archive_file_ofs;
      pmVar15 = &state.m_cur_archive_file_ofs;
      pmVar16 = &state.m_cur_archive_file_ofs;
      state.m_cur_archive_file_ofs = CONCAT44(state.m_cur_archive_file_ofs._4_4_,(int)comp_size);
      sVar22 = 0x18;
      sVar17 = 0x10;
      sVar13 = 8;
      pmVar1 = &state.m_cur_archive_file_ofs;
      sVar11 = 0x10;
    }
    else {
      pmVar10 = &state.m_comp_size;
      pmVar15 = &state.m_comp_size;
      pmVar16 = &state.m_comp_size;
      state.m_cur_archive_file_ofs = comp_size;
      state.m_comp_size._0_4_ = (undefined4)uncomp_size;
      pmVar1 = &state.m_comp_size;
      uVar3 = (undefined1)(uncomp_size >> 0x20);
      sVar11 = 0x18;
      sVar22 = 0x38;
      sVar17 = 0x30;
      sVar13 = 0x28;
    }
    *(undefined1 *)((long)pmVar1 + 4) = uVar3;
    *(char *)((long)pmVar16 + 5) = (char)(uncomp_size >> sVar13);
    *(char *)((long)pmVar15 + 6) = (char)(uncomp_size >> sVar17);
    *(char *)((long)pmVar10 + 7) = (char)(uncomp_size >> sVar22);
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar27,&state,sVar11);
    if (sVar12 != sVar11) {
      return 0;
    }
    mVar27 = mVar27 + sVar11;
    uVar26 = uncomp_size;
  }
  user_extra_data_00 = user_extra_data_central;
  if (local_108 != (mz_uint8 *)0x0) {
    pmVar10 = (mz_uint64 *)0x0;
    if (0xfffffffe < uVar26) {
      pmVar10 = &uncomp_size;
    }
    pmVar15 = &comp_size;
    if (uVar26 < 0xffffffff) {
      pmVar15 = (mz_uint64 *)0x0;
    }
    pmVar16 = (mz_uint64 *)0x0;
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar16 = &local_dir_header_ofs;
    }
    mVar6 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar10,pmVar15,pmVar16);
    local_b8 = CONCAT44(extraout_var_00,mVar6);
    uVar26 = uncomp_size;
  }
  mVar4 = mz_zip_writer_add_to_central_dir
                    (pZip,local_118,filename_size,local_108,(mz_uint16)local_b8,local_60,
                     (mz_uint16)local_68,uVar26,comp_size,(mz_uint32)local_70,(mz_uint16)local_bc,
                     (mz_uint16)local_a8,(mz_uint16)local_c0,(mz_uint16)local_c4,
                     local_dir_header_ofs,(mz_uint32)local_b0,user_extra_data_00,
                     user_extra_data_central_len);
  if (mVar4 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = mVar27;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex_v2(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size,
                                    mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32, MZ_TIME_T *last_modified,
                                    const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 method = 0, dos_time = 0, dos_date = 0;
    mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
    mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    tdefl_compressor *pComp = NULL;
    mz_bool store_data_uncompressed;
    mz_zip_internal_state *pState;
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_uint16 bit_flags = 0;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;

    if (uncomp_size || (buf_size && !(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
        bit_flags |= MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        bit_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    level = level_and_flags & 0xF;
    store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
        if (((mz_uint64)buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

#ifndef MINIZ_NO_TIME
    if (last_modified != NULL)
    {
        mz_zip_time_t_to_dos_time(*last_modified, &dos_time, &dos_date);
    }
    else
    {
        MZ_TIME_T cur_time;
        time(&cur_time);
        mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
    }
#endif /* #ifndef MINIZ_NO_TIME */

	if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
	{
		uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
		uncomp_size = buf_size;
		if (uncomp_size <= 3)
		{
			level = 0;
			store_data_uncompressed = MZ_TRUE;
		}
	}

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size
			+ MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + user_extra_data_len +
			pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + user_extra_data_central_len
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

    if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
    {
        /* Set DOS Subdirectory attribute bit. */
        ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;

        /* Subdirectories cannot contain data. */
        if ((buf_size) || (uncomp_size))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    }

    /* Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.) */
    if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size + (pState->m_zip64 ? MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE : 0))) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if ((!store_data_uncompressed) && (buf_size))
    {
        if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        return MZ_FALSE;
    }

    local_dir_header_ofs += num_alignment_padding_bytes;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }
    cur_archive_file_ofs += num_alignment_padding_bytes;

    MZ_CLEAR_ARR(local_dir_header);

    if (!store_data_uncompressed || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
    {
        method = MZ_DEFLATED;
    }

    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;

        if (pExtra_data != NULL)
        {
            if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

            cur_archive_file_ofs += extra_size;
        }
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)user_extra_data_len, 0, 0, 0, method, bit_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_archive_file_ofs += archive_name_size;
    }

	if (user_extra_data_len > 0)
	{
		if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
			return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

		cur_archive_file_ofs += user_extra_data_len;
	}

    if (store_data_uncompressed)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += buf_size;
        comp_size = buf_size;
    }
    else if (buf_size)
    {
        mz_zip_writer_add_state state;

        state.m_pZip = pZip;
        state.m_cur_archive_file_ofs = cur_archive_file_ofs;
        state.m_comp_size = 0;

        if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
            (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
            return mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
        }

        comp_size = state.m_comp_size;
        cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    pComp = NULL;

    if (uncomp_size)
    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_ASSERT(bit_flags & MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR);

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, (mz_uint16)extra_size, pComment,
                                          comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}